

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::SonarQubeReporter::writeTestFile
          (SonarQubeReporter *this,StringRef filename,
          vector<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*,_std::allocator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*>_>
          *testCaseNodes)

{
  StringRef name;
  bool bVar1;
  XmlWriter *in_RDX;
  ScopedElement *in_RDI;
  StringRef attribute;
  Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode> **child;
  const_iterator __end1;
  const_iterator __begin1;
  vector<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*,_std::allocator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*>_>
  *__range1;
  ScopedElement e;
  ScopedElement *this_00;
  undefined8 in_stack_ffffffffffffff58;
  XmlFormatting fmt;
  string *in_stack_ffffffffffffff60;
  __normal_iterator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*const_*,_std::vector<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*,_std::allocator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*>_>_>
  in_stack_ffffffffffffff68;
  allocator<char> *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  TestCaseNode *in_stack_ffffffffffffff98;
  SonarQubeReporter *in_stack_ffffffffffffffa0;
  allocator<char> local_51;
  string local_50 [72];
  XmlWriter *pXStack_8;
  
  fmt = (XmlFormatting)((ulong)in_stack_ffffffffffffff58 >> 0x20);
  pXStack_8 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  operator|(Newline,Indent);
  XmlWriter::scopedElement
            ((XmlWriter *)in_stack_ffffffffffffff68._M_current,in_stack_ffffffffffffff60,fmt);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  this_00 = in_RDI + 0xb;
  attribute = operator____sr((char *)in_RDI,(size_t)this_00);
  name.m_size = (size_type)in_stack_ffffffffffffffa0;
  name.m_start = (char *)in_stack_ffffffffffffff98;
  XmlWriter::writeAttribute(pXStack_8,name,attribute);
  std::
  vector<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*,_std::allocator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*>_>
  ::begin((vector<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*,_std::allocator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*>_>
           *)this_00);
  std::
  vector<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*,_std::allocator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*>_>
  ::end((vector<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*,_std::allocator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*>_>
         *)this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*const_*,_std::vector<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*,_std::allocator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*>_>_>
                        *)in_RDI,
                       (__normal_iterator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*const_*,_std::vector<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*,_std::allocator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*>_>_>
                        *)this_00);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*const_*,_std::vector<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*,_std::allocator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*>_>_>
    ::operator*((__normal_iterator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*const_*,_std::vector<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*,_std::allocator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*>_>_>
                 *)&stack0xffffffffffffff68);
    writeTestCase(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    __gnu_cxx::
    __normal_iterator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*const_*,_std::vector<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*,_std::allocator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*>_>_>
    ::operator++((__normal_iterator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*const_*,_std::vector<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*,_std::allocator<const_Catch::CumulativeReporterBase::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase::SectionNode>_*>_>_>
                  *)&stack0xffffffffffffff68);
  }
  XmlWriter::ScopedElement::~ScopedElement(in_RDI);
  return;
}

Assistant:

void SonarQubeReporter::writeTestFile(StringRef filename, std::vector<TestCaseNode const*> const& testCaseNodes) {
        XmlWriter::ScopedElement e = xml.scopedElement("file");
        xml.writeAttribute("path"_sr, filename);

        for (auto const& child : testCaseNodes)
            writeTestCase(*child);
    }